

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read669.c
# Opt level: O3

int it_669_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  byte *pbVar1;
  int32 iVar2;
  int iVar3;
  char *ptr;
  long lVar4;
  int n;
  
  if ((sample->flags & 0x10) == 0) {
    iVar3 = sample->length;
  }
  else {
    iVar3 = sample->length;
    n = sample->loop_end;
    if (iVar3 - n != 0 && n <= iVar3) {
      sample->length = n;
      lVar4 = (long)(iVar3 - n);
      goto LAB_00714910;
    }
  }
  lVar4 = 0;
  n = iVar3;
LAB_00714910:
  ptr = (char *)malloc((long)n);
  sample->data = ptr;
  if (ptr == (char *)0x0) {
    return -1;
  }
  if (n != 0) {
    iVar2 = dumbfile_getnc(ptr,n,f);
    if (iVar2 < sample->length) {
      if (iVar2 < 1) {
        sample->flags = '\0';
        return 0;
      }
      sample->length = iVar2;
      if (iVar2 < sample->loop_end) {
        sample->loop_end = iVar2;
      }
    }
    else {
      dumbfile_skip(f,lVar4);
      iVar3 = dumbfile_error(f);
      if (iVar3 != 0) {
        return -1;
      }
      if (sample->length < 1) {
        return 0;
      }
    }
    lVar4 = 0;
    do {
      pbVar1 = (byte *)((long)sample->data + lVar4);
      *pbVar1 = *pbVar1 ^ 0x80;
      lVar4 = lVar4 + 1;
    } while (lVar4 < sample->length);
  }
  return 0;
}

Assistant:

static int it_669_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc(sample->length);

	if (!sample->data)
		return -1;

	if (sample->length)
	{
		i = dumbfile_getnc(sample->data, sample->length, f);
		
		if (i < sample->length) {
			//return -1;
			// ficking truncated files
			if (i <= 0) {
				sample->flags = 0;
				return 0;
			}
			sample->length = i;
			if (sample->loop_end > i) sample->loop_end = i;
		} else {
			/* skip truncated data */
			dumbfile_skip(f, truncated_size);
			// Should we be truncating it?
			if (dumbfile_error(f))
				return -1;
		}

		for (i = 0; i < sample->length; i++)
			((signed char *)sample->data)[i] ^= 0x80;
	}

	return 0;
}